

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

ShaderExecutor *
deqp::gles31::Functional::anon_unknown_1::createGetConstantExecutor
          (RenderContext *renderCtx,ShaderType shaderType,DataType dataType,string *varName,
          string *extName)

{
  bool bVar1;
  ContextType ctxType;
  ulong uVar2;
  ShaderExecutor *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  VarType local_1a0;
  allocator<char> local_181;
  string local_180;
  Symbol local_160;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  ShaderSpec shaderSpec;
  bool supportsES32;
  string *extName_local;
  string *varName_local;
  DataType dataType_local;
  ShaderType shaderType_local;
  RenderContext *renderCtx_local;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  shaderSpec.source.field_2._12_4_ = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,(ApiType)shaderSpec.source.field_2._12_4_);
  deqp::gls::ShaderExecUtil::ShaderSpec::ShaderSpec((ShaderSpec *)local_b0);
  local_b0._0_4_ = bVar1 | GLSL_VERSION_310_ES;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"result = ",&local_111);
  std::operator+(&local_f0,&local_110,varName);
  std::operator+(&local_d0,&local_f0,";\n");
  std::__cxx11::string::operator=
            ((string *)(shaderSpec.globalDeclarations.field_2._M_local_buf + 8),(string *)&local_d0)
  ;
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"result",&local_181);
  glu::VarType::VarType(&local_1a0,dataType,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_160,&local_180,&local_1a0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               *)&shaderSpec.inputs.
                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_160);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_160);
  glu::VarType::~VarType(&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) goto LAB_0236a987;
  if (bVar1) {
    bVar1 = std::operator==(extName,"GL_OES_sample_variables");
    if (bVar1) goto LAB_0236a987;
    bVar1 = std::operator==(extName,"GL_EXT_geometry_shader");
    if (bVar1) goto LAB_0236a987;
    bVar1 = std::operator==(extName,"GL_EXT_tessellation_shader");
    if (bVar1) goto LAB_0236a987;
  }
  std::operator+(&local_1e0,"#extension ",extName);
  std::operator+(&local_1c0,&local_1e0," : require\n");
  std::__cxx11::string::operator=
            ((string *)
             &shaderSpec.outputs.
              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
LAB_0236a987:
  pSVar3 = deqp::gls::ShaderExecUtil::createExecutor(renderCtx,shaderType,(ShaderSpec *)local_b0);
  deqp::gls::ShaderExecUtil::ShaderSpec::~ShaderSpec((ShaderSpec *)local_b0);
  return pSVar3;
}

Assistant:

static gls::ShaderExecUtil::ShaderExecutor* createGetConstantExecutor (const glu::RenderContext&	renderCtx,
																	   glu::ShaderType				shaderType,
																	   glu::DataType				dataType,
																	   const std::string&			varName,
																	   const std::string&			extName)
{
	using namespace gls::ShaderExecUtil;

	const bool	supportsES32	= contextSupports(renderCtx.getType(), glu::ApiType::es(3, 2));
	ShaderSpec	shaderSpec;

	shaderSpec.version	= supportsES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	shaderSpec.source	= string("result = ") + varName + ";\n";

	shaderSpec.outputs.push_back(Symbol("result", glu::VarType(dataType, glu::PRECISION_HIGHP)));

	if (!extName.empty() && !(supportsES32 && (extName == "GL_OES_sample_variables" || extName == "GL_EXT_geometry_shader" || extName == "GL_EXT_tessellation_shader")))
		shaderSpec.globalDeclarations = "#extension " + extName + " : require\n";

	return createExecutor(renderCtx, shaderType, shaderSpec);
}